

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CalcTangentsProcess.cpp
# Opt level: O0

bool __thiscall
Assimp::CalcTangentsProcess::ProcessMesh(CalcTangentsProcess *this,aiMesh *pMesh,uint meshIndex)

{
  aiVector3t<float> *paVar1;
  uint uVar2;
  uint uVar3;
  bool bVar4;
  Logger *pLVar5;
  basic_formatter *this_00;
  ulong uVar6;
  aiVector3D *paVar7;
  size_type sVar8;
  reference pvVar9;
  aiVector3D *paVar10;
  uint uVar11;
  float fVar12;
  double dVar13;
  reference rVar14;
  aiVector3t<float> aVar15;
  aiVector3t<float> aVar16;
  bool local_5f2;
  bool local_5ee;
  aiVector3t<float> *local_518;
  aiVector3t<float> *local_4f0;
  uint local_4a0;
  uint local_49c;
  uint b_3;
  uint b_2;
  aiVector3D smoothBitangent;
  aiVector3D smoothTangent;
  reference local_470;
  uint local_460;
  uint local_45c;
  uint idx_1;
  uint b_1;
  aiVector3D *origBitang;
  aiVector3D *origTang;
  aiVector3D *origNorm;
  aiVector3D *origPos;
  _Bit_type local_430;
  value_type_conflict4 local_424;
  undefined1 local_420 [4];
  uint a_1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> closeVertices;
  undefined1 local_400 [4];
  float fLimit;
  vector<unsigned_int,_std::allocator<unsigned_int>_> verticesFound;
  pair<Assimp::SpatialSort,_float> *blubb;
  vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
  *avf;
  undefined1 local_3d0 [4];
  float posEpsilon;
  SpatialSort _vertexFinder;
  SpatialSort *vertexFinder;
  bool invalid_bitangent;
  bool invalid_tangent;
  aiVector3t<float> local_340;
  undefined1 local_330 [8];
  aiVector3D localBitangent;
  aiVector3t<float> local_300;
  undefined1 local_2f0 [8];
  aiVector3D localTangent;
  uint p;
  uint b;
  aiVector3D bitangent;
  aiVector3D tangent;
  float dirCorrection;
  float ty;
  float tx;
  float sy;
  float sx;
  float local_29c;
  float fStack_298;
  aiVector3D w;
  float local_280;
  float fStack_27c;
  aiVector3D v;
  uint p2;
  uint p1;
  uint p0;
  float local_260;
  aiVector3t<float> local_25c;
  reference local_250;
  uint local_240;
  uint local_23c;
  uint idx;
  uint i;
  aiFace *face;
  aiVector3D *paStack_228;
  uint a;
  aiVector3D *meshBitang;
  aiVector3D *meshTang;
  aiVector3D *meshTex;
  aiVector3D *meshNorm;
  aiVector3D *meshPos;
  float qnan;
  vector<bool,_std::allocator<bool>_> vertexDone;
  float angleEpsilon;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_48;
  uint local_24;
  aiMesh *paStack_20;
  uint meshIndex_local;
  aiMesh *pMesh_local;
  CalcTangentsProcess *this_local;
  
  if (pMesh->mTangents == (aiVector3D *)0x0) {
    local_24 = meshIndex;
    paStack_20 = pMesh;
    pMesh_local = (aiMesh *)this;
    if ((pMesh->mPrimitiveTypes & 0xc) == 0) {
      pLVar5 = DefaultLogger::get();
      Logger::info(pLVar5,"Tangents are undefined for line and point meshes");
      this_local._7_1_ = 0;
    }
    else if (pMesh->mNormals == (aiVector3D *)0x0) {
      pLVar5 = DefaultLogger::get();
      Logger::error(pLVar5,"Failed to compute tangents; need normals");
      this_local._7_1_ = 0;
    }
    else if ((this->configSourceUV < 8) &&
            (pMesh->mTextureCoords[this->configSourceUV] != (aiVector3D *)0x0)) {
      vertexDone.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_end_of_storage._0_4_ = 0x3f7ff972;
      uVar11 = pMesh->mNumVertices;
      meshPos._7_1_ = 0;
      std::allocator<bool>::allocator((allocator<bool> *)((long)&meshPos + 6));
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)&qnan,(ulong)uVar11,
                 (bool *)((long)&meshPos + 7),(allocator<bool> *)((long)&meshPos + 6));
      std::allocator<bool>::~allocator((allocator<bool> *)((long)&meshPos + 6));
      meshPos._0_4_ = get_qnan();
      uVar6 = (ulong)paStack_20->mNumVertices;
      paVar7 = (aiVector3D *)operator_new__(uVar6 * 0xc);
      if (uVar6 != 0) {
        local_4f0 = paVar7;
        do {
          aiVector3t<float>::aiVector3t(local_4f0);
          local_4f0 = local_4f0 + 1;
        } while (local_4f0 != paVar7 + uVar6);
      }
      paStack_20->mTangents = paVar7;
      uVar6 = (ulong)paStack_20->mNumVertices;
      paVar7 = (aiVector3D *)operator_new__(uVar6 * 0xc);
      if (uVar6 != 0) {
        local_518 = paVar7;
        do {
          aiVector3t<float>::aiVector3t(local_518);
          local_518 = local_518 + 1;
        } while (local_518 != paVar7 + uVar6);
      }
      paStack_20->mBitangents = paVar7;
      meshNorm = paStack_20->mVertices;
      meshTex = paStack_20->mNormals;
      meshTang = paStack_20->mTextureCoords[this->configSourceUV];
      meshBitang = paStack_20->mTangents;
      paStack_228 = paStack_20->mBitangents;
      for (face._4_4_ = 0; face._4_4_ < paStack_20->mNumFaces; face._4_4_ = face._4_4_ + 1) {
        _idx = paStack_20->mFaces + face._4_4_;
        if (_idx->mNumIndices < 3) {
          for (local_23c = 0; local_23c < _idx->mNumIndices; local_23c = local_23c + 1) {
            local_240 = _idx->mIndices[local_23c];
            rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)&qnan,(ulong)local_240);
            local_250 = rVar14;
            std::_Bit_reference::operator=(&local_250,true);
            aiVector3t<float>::aiVector3t(&local_25c,meshPos._0_4_);
            meshBitang[local_240].z = local_25c.z;
            meshBitang[local_240].x = local_25c.x;
            meshBitang[local_240].y = local_25c.y;
            aiVector3t<float>::aiVector3t((aiVector3t<float> *)&p1,meshPos._0_4_);
            paVar7 = paStack_228 + local_240;
            paVar7->x = (float)p1;
            paVar7->y = (float)p0;
            paVar7->z = local_260;
          }
        }
        else {
          uVar11 = *_idx->mIndices;
          uVar2 = _idx->mIndices[1];
          uVar3 = _idx->mIndices[2];
          aVar15 = ::operator-(meshNorm + uVar2,meshNorm + uVar11);
          aVar16 = ::operator-(meshNorm + uVar3,meshNorm + uVar11);
          tx = meshTang[uVar2].x - meshTang[uVar11].x;
          ty = meshTang[uVar2].y - meshTang[uVar11].y;
          dirCorrection = meshTang[uVar3].x - meshTang[uVar11].x;
          tangent.z = meshTang[uVar3].y - meshTang[uVar11].y;
          uVar11 = -(uint)(dirCorrection * ty + -(tangent.z * tx) < 0.0);
          fVar12 = (float)(~uVar11 & 0x3f800000 | uVar11 & 0xbf800000);
          if ((tx * tangent.z == ty * dirCorrection) &&
             (!NAN(tx * tangent.z) && !NAN(ty * dirCorrection))) {
            tx = 0.0;
            ty = 1.0;
            dirCorrection = 1.0;
            tangent.z = 0.0;
          }
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)&bitangent.y);
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)&p);
          local_29c = aVar16.x;
          local_280 = aVar15.x;
          bitangent.y = (local_29c * ty + -(local_280 * tangent.z)) * fVar12;
          fStack_298 = aVar16.y;
          fStack_27c = aVar15.y;
          bitangent.z = (fStack_298 * ty + -(fStack_27c * tangent.z)) * fVar12;
          p = (uint)((local_29c * tx + -(local_280 * dirCorrection)) * fVar12);
          b = (uint)((fStack_298 * tx + -(fStack_27c * dirCorrection)) * fVar12);
          bitangent.x = (aVar16.z * tx + -(aVar15.z * dirCorrection)) * fVar12;
          for (localTangent.z = 0.0; (uint)localTangent.z < _idx->mNumIndices;
              localTangent.z = (float)((int)localTangent.z + 1)) {
            localTangent.y = (float)_idx->mIndices[(uint)localTangent.z];
            paVar1 = meshTex + (uint)localTangent.y;
            fVar12 = ::operator*((aiVector3t<float> *)&bitangent.y,paVar1);
            aVar15 = ::operator*(paVar1,fVar12);
            local_300 = aVar15;
            aVar15 = ::operator-((aiVector3t<float> *)&bitangent.y,&local_300);
            localTangent.x = aVar15.z;
            register0x00001200 = aVar15._0_8_;
            paVar1 = meshTex + (uint)localTangent.y;
            local_2f0 = (undefined1  [8])register0x00001200;
            fVar12 = ::operator*((aiVector3t<float> *)&p,paVar1);
            aVar15 = ::operator*(paVar1,fVar12);
            local_340 = aVar15;
            aVar15 = ::operator-((aiVector3t<float> *)&p,&local_340);
            localBitangent.x = aVar15.z;
            local_330 = aVar15._0_8_;
            aiVector3t<float>::NormalizeSafe((aiVector3t<float> *)local_2f0);
            aiVector3t<float>::NormalizeSafe((aiVector3t<float> *)local_330);
            bVar4 = is_special_float((float)local_2f0._0_4_);
            local_5ee = true;
            if (!bVar4) {
              bVar4 = is_special_float((float)local_2f0._4_4_);
              local_5ee = true;
              if (!bVar4) {
                local_5ee = is_special_float(localTangent.x);
              }
            }
            bVar4 = is_special_float((float)local_330._0_4_);
            local_5f2 = true;
            if (!bVar4) {
              bVar4 = is_special_float((float)local_330._4_4_);
              local_5f2 = true;
              if (!bVar4) {
                local_5f2 = is_special_float(localBitangent.x);
              }
            }
            if (local_5ee != local_5f2) {
              if (local_5ee == false) {
                aVar15 = operator^((aiVector3t<float> *)local_2f0,meshTex + (uint)localTangent.y);
                localBitangent.x = aVar15.z;
                local_330 = aVar15._0_8_;
                aiVector3t<float>::NormalizeSafe((aiVector3t<float> *)local_330);
              }
              else {
                aVar15 = operator^(meshTex + (uint)localTangent.y,(aiVector3t<float> *)local_330);
                localTangent.x = aVar15.z;
                local_2f0 = aVar15._0_8_;
                aiVector3t<float>::NormalizeSafe((aiVector3t<float> *)local_2f0);
              }
            }
            paVar7 = meshBitang + (uint)localTangent.y;
            paVar7->x = (float)local_2f0._0_4_;
            paVar7->y = (float)local_2f0._4_4_;
            paVar7->z = localTangent.x;
            paVar7 = paStack_228 + (uint)localTangent.y;
            paVar7->x = (float)local_330._0_4_;
            paVar7->y = (float)local_330._4_4_;
            paVar7->z = localBitangent.x;
          }
        }
      }
      _vertexFinder.mPositions.
      super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      SpatialSort::SpatialSort((SpatialSort *)local_3d0);
      if ((this->super_BaseProcess).shared != (SharedPostProcessInfo *)0x0) {
        SharedPostProcessInfo::
        GetProperty<std::vector<std::pair<Assimp::SpatialSort,float>,std::allocator<std::pair<Assimp::SpatialSort,float>>>>
                  ((this->super_BaseProcess).shared,"$Spat",
                   (vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
                    **)&blubb);
        if (blubb != (pair<Assimp::SpatialSort,_float> *)0x0) {
          verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)std::
                        vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
                        ::operator[]((vector<std::pair<Assimp::SpatialSort,_float>,_std::allocator<std::pair<Assimp::SpatialSort,_float>_>_>
                                      *)blubb,(ulong)local_24);
          avf._4_4_ = ((reference)
                      verticesFound.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage)->second;
          _vertexFinder.mPositions.
          super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)verticesFound.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage;
        }
      }
      if (_vertexFinder.mPositions.
          super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
        SpatialSort::Fill((SpatialSort *)local_3d0,paStack_20->mVertices,paStack_20->mNumVertices,
                          0xc,true);
        _vertexFinder.mPositions.
        super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3d0;
        avf._4_4_ = ComputePositionEpsilon(paStack_20);
      }
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_400);
      dVar13 = std::cos((double)(ulong)(uint)this->configMaxAngle);
      closeVertices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = SUB84(dVar13,0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_420);
      for (local_424 = 0; local_424 < paStack_20->mNumVertices; local_424 = local_424 + 1) {
        rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           ((vector<bool,_std::allocator<bool>_> *)&qnan,(ulong)local_424);
        local_430 = rVar14._M_mask;
        origPos = (aiVector3D *)rVar14._M_p;
        bVar4 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&origPos);
        if (!bVar4) {
          origNorm = paStack_20->mVertices + local_424;
          origTang = paStack_20->mNormals + local_424;
          origBitang = paStack_20->mTangents + local_424;
          _idx_1 = paStack_20->mBitangents + local_424;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_420,0);
          SpatialSort::FindPositions
                    ((SpatialSort *)
                     _vertexFinder.mPositions.
                     super__Vector_base<Assimp::SpatialSort::Entry,_std::allocator<Assimp::SpatialSort::Entry>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,origNorm,avf._4_4_,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_400);
          sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_400);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_420,sVar8 + 5);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_420,&local_424);
          local_45c = 0;
          while( true ) {
            uVar6 = (ulong)local_45c;
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_400);
            if (sVar8 <= uVar6) break;
            pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_400,
                                (ulong)local_45c);
            local_460 = *pvVar9;
            rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((vector<bool,_std::allocator<bool>_> *)&qnan,(ulong)local_460);
            local_470 = rVar14;
            bVar4 = std::_Bit_reference::operator_cast_to_bool(&local_470);
            if (!bVar4) {
              fVar12 = ::operator*(meshTex + local_460,origTang);
              if (0.9999 <= fVar12) {
                fVar12 = ::operator*(meshBitang + local_460,origBitang);
                if (closeVertices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <= fVar12) {
                  fVar12 = ::operator*(paStack_228 + local_460,_idx_1);
                  if (closeVertices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ <= fVar12) {
                    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_420,
                               &local_460);
                    rVar14 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                       ((vector<bool,_std::allocator<bool>_> *)&qnan,
                                        (ulong)local_460);
                    smoothTangent._4_8_ = rVar14._M_p;
                    std::_Bit_reference::operator=((_Bit_reference *)&smoothTangent.y,true);
                  }
                }
              }
            }
            local_45c = local_45c + 1;
          }
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)&smoothBitangent.y,0.0,0.0,0.0);
          aiVector3t<float>::aiVector3t((aiVector3t<float> *)&b_3,0.0,0.0,0.0);
          local_49c = 0;
          while( true ) {
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_420);
            paVar7 = meshBitang;
            if (sVar8 <= local_49c) break;
            pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_420,
                                (ulong)local_49c);
            aiVector3t<float>::operator+=((aiVector3t<float> *)&smoothBitangent.y,paVar7 + *pvVar9);
            paVar7 = paStack_228;
            pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_420,
                                (ulong)local_49c);
            aiVector3t<float>::operator+=((aiVector3t<float> *)&b_3,paVar7 + *pvVar9);
            local_49c = local_49c + 1;
          }
          aiVector3t<float>::Normalize((aiVector3t<float> *)&smoothBitangent.y);
          aiVector3t<float>::Normalize((aiVector3t<float> *)&b_3);
          local_4a0 = 0;
          while( true ) {
            sVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_420);
            paVar7 = meshBitang;
            if (sVar8 <= local_4a0) break;
            pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_420,
                                (ulong)local_4a0);
            paVar10 = paStack_228;
            paVar7 = paVar7 + *pvVar9;
            paVar7->x = smoothBitangent.y;
            paVar7->y = smoothBitangent.z;
            paVar7->z = smoothTangent.x;
            pvVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_420,
                                (ulong)local_4a0);
            paVar10 = paVar10 + *pvVar9;
            paVar10->x = (float)b_3;
            paVar10->y = (float)b_2;
            paVar10->z = smoothBitangent.x;
            local_4a0 = local_4a0 + 1;
          }
        }
      }
      this_local._7_1_ = 1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_420);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_400);
      SpatialSort::~SpatialSort((SpatialSort *)local_3d0);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)&qnan);
    }
    else {
      pLVar5 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[52]>
                (&local_1c0,(char (*) [52])"Failed to compute tangents; need UV data in channel");
      this_00 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                          &local_1c0,&this->configSourceUV);
      Formatter::basic_formatter::operator_cast_to_string(&local_48,this_00);
      Logger::error(pLVar5,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_1c0);
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CalcTangentsProcess::ProcessMesh( aiMesh* pMesh, unsigned int meshIndex)
{
    // we assume that the mesh is still in the verbose vertex format where each face has its own set
    // of vertices and no vertices are shared between faces. Sadly I don't know any quick test to
    // assert() it here.
    // assert( must be verbose, dammit);

    if (pMesh->mTangents) // this implies that mBitangents is also there
        return false;

    // If the mesh consists of lines and/or points but not of
    // triangles or higher-order polygons the normal vectors
    // are undefined.
    if (!(pMesh->mPrimitiveTypes & (aiPrimitiveType_TRIANGLE | aiPrimitiveType_POLYGON)))
    {
        ASSIMP_LOG_INFO("Tangents are undefined for line and point meshes");
        return false;
    }

    // what we can check, though, is if the mesh has normals and texture coordinates. That's a requirement
    if( pMesh->mNormals == NULL)
    {
        ASSIMP_LOG_ERROR("Failed to compute tangents; need normals");
        return false;
    }
    if( configSourceUV >= AI_MAX_NUMBER_OF_TEXTURECOORDS || !pMesh->mTextureCoords[configSourceUV] )
    {
        ASSIMP_LOG_ERROR((Formatter::format("Failed to compute tangents; need UV data in channel"),configSourceUV));
        return false;
    }

    const float angleEpsilon = 0.9999f;

    std::vector<bool> vertexDone( pMesh->mNumVertices, false);
    const float qnan = get_qnan();

    // create space for the tangents and bitangents
    pMesh->mTangents = new aiVector3D[pMesh->mNumVertices];
    pMesh->mBitangents = new aiVector3D[pMesh->mNumVertices];

    const aiVector3D* meshPos = pMesh->mVertices;
    const aiVector3D* meshNorm = pMesh->mNormals;
    const aiVector3D* meshTex = pMesh->mTextureCoords[configSourceUV];
    aiVector3D* meshTang = pMesh->mTangents;
    aiVector3D* meshBitang = pMesh->mBitangents;

    // calculate the tangent and bitangent for every face
    for( unsigned int a = 0; a < pMesh->mNumFaces; a++)
    {
        const aiFace& face = pMesh->mFaces[a];
        if (face.mNumIndices < 3)
        {
            // There are less than three indices, thus the tangent vector
            // is not defined. We are finished with these vertices now,
            // their tangent vectors are set to qnan.
            for (unsigned int i = 0; i < face.mNumIndices;++i)
            {
                unsigned int idx = face.mIndices[i];
                vertexDone  [idx] = true;
                meshTang    [idx] = aiVector3D(qnan);
                meshBitang  [idx] = aiVector3D(qnan);
            }

            continue;
        }

        // triangle or polygon... we always use only the first three indices. A polygon
        // is supposed to be planar anyways....
        // FIXME: (thom) create correct calculation for multi-vertex polygons maybe?
        const unsigned int p0 = face.mIndices[0], p1 = face.mIndices[1], p2 = face.mIndices[2];

        // position differences p1->p2 and p1->p3
        aiVector3D v = meshPos[p1] - meshPos[p0], w = meshPos[p2] - meshPos[p0];

        // texture offset p1->p2 and p1->p3
        float sx = meshTex[p1].x - meshTex[p0].x, sy = meshTex[p1].y - meshTex[p0].y;
        float tx = meshTex[p2].x - meshTex[p0].x, ty = meshTex[p2].y - meshTex[p0].y;
        float dirCorrection = (tx * sy - ty * sx) < 0.0f ? -1.0f : 1.0f;
        // when t1, t2, t3 in same position in UV space, just use default UV direction.
        if (  sx * ty == sy * tx ) {
            sx = 0.0; sy = 1.0;
            tx = 1.0; ty = 0.0;
        }

        // tangent points in the direction where to positive X axis of the texture coord's would point in model space
        // bitangent's points along the positive Y axis of the texture coord's, respectively
        aiVector3D tangent, bitangent;
        tangent.x = (w.x * sy - v.x * ty) * dirCorrection;
        tangent.y = (w.y * sy - v.y * ty) * dirCorrection;
        tangent.z = (w.z * sy - v.z * ty) * dirCorrection;
        bitangent.x = (w.x * sx - v.x * tx) * dirCorrection;
        bitangent.y = (w.y * sx - v.y * tx) * dirCorrection;
        bitangent.z = (w.z * sx - v.z * tx) * dirCorrection;

        // store for every vertex of that face
        for( unsigned int b = 0; b < face.mNumIndices; ++b ) {
            unsigned int p = face.mIndices[b];

            // project tangent and bitangent into the plane formed by the vertex' normal
            aiVector3D localTangent = tangent - meshNorm[p] * (tangent * meshNorm[p]);
            aiVector3D localBitangent = bitangent - meshNorm[p] * (bitangent * meshNorm[p]);
            localTangent.NormalizeSafe(); localBitangent.NormalizeSafe();

            // reconstruct tangent/bitangent according to normal and bitangent/tangent when it's infinite or NaN.
            bool invalid_tangent = is_special_float(localTangent.x) || is_special_float(localTangent.y) || is_special_float(localTangent.z);
            bool invalid_bitangent = is_special_float(localBitangent.x) || is_special_float(localBitangent.y) || is_special_float(localBitangent.z);
            if (invalid_tangent != invalid_bitangent) {
                if (invalid_tangent) {
                    localTangent = meshNorm[p] ^ localBitangent;
                    localTangent.NormalizeSafe();
                } else {
                    localBitangent = localTangent ^ meshNorm[p];
                    localBitangent.NormalizeSafe();
                }
            }

            // and write it into the mesh.
            meshTang[ p ]   = localTangent;
            meshBitang[ p ] = localBitangent;
        }
    }


    // create a helper to quickly find locally close vertices among the vertex array
    // FIX: check whether we can reuse the SpatialSort of a previous step
    SpatialSort* vertexFinder = NULL;
    SpatialSort  _vertexFinder;
    float posEpsilon;
    if (shared)
    {
        std::vector<std::pair<SpatialSort,float> >* avf;
        shared->GetProperty(AI_SPP_SPATIAL_SORT,avf);
        if (avf)
        {
            std::pair<SpatialSort,float>& blubb = avf->operator [] (meshIndex);
            vertexFinder = &blubb.first;
            posEpsilon = blubb.second;;
        }
    }
    if (!vertexFinder)
    {
        _vertexFinder.Fill(pMesh->mVertices, pMesh->mNumVertices, sizeof( aiVector3D));
        vertexFinder = &_vertexFinder;
        posEpsilon = ComputePositionEpsilon(pMesh);
    }
    std::vector<unsigned int> verticesFound;

    const float fLimit = std::cos(configMaxAngle);
    std::vector<unsigned int> closeVertices;

    // in the second pass we now smooth out all tangents and bitangents at the same local position
    // if they are not too far off.
    for( unsigned int a = 0; a < pMesh->mNumVertices; a++)
    {
        if( vertexDone[a])
            continue;

        const aiVector3D& origPos = pMesh->mVertices[a];
        const aiVector3D& origNorm = pMesh->mNormals[a];
        const aiVector3D& origTang = pMesh->mTangents[a];
        const aiVector3D& origBitang = pMesh->mBitangents[a];
        closeVertices.resize( 0 );

        // find all vertices close to that position
        vertexFinder->FindPositions( origPos, posEpsilon, verticesFound);

        closeVertices.reserve (verticesFound.size()+5);
        closeVertices.push_back( a);

        // look among them for other vertices sharing the same normal and a close-enough tangent/bitangent
        for( unsigned int b = 0; b < verticesFound.size(); b++)
        {
            unsigned int idx = verticesFound[b];
            if( vertexDone[idx])
                continue;
            if( meshNorm[idx] * origNorm < angleEpsilon)
                continue;
            if(  meshTang[idx] * origTang < fLimit)
                continue;
            if( meshBitang[idx] * origBitang < fLimit)
                continue;

            // it's similar enough -> add it to the smoothing group
            closeVertices.push_back( idx);
            vertexDone[idx] = true;
        }

        // smooth the tangents and bitangents of all vertices that were found to be close enough
        aiVector3D smoothTangent( 0, 0, 0), smoothBitangent( 0, 0, 0);
        for( unsigned int b = 0; b < closeVertices.size(); ++b)
        {
            smoothTangent += meshTang[ closeVertices[b] ];
            smoothBitangent += meshBitang[ closeVertices[b] ];
        }
        smoothTangent.Normalize();
        smoothBitangent.Normalize();

        // and write it back into all affected tangents
        for( unsigned int b = 0; b < closeVertices.size(); ++b)
        {
            meshTang[ closeVertices[b] ] = smoothTangent;
            meshBitang[ closeVertices[b] ] = smoothBitangent;
        }
    }
    return true;
}